

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStringObject::DeleteProperty
          (JavascriptStringObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ScriptContext *scriptContext;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  char16 *varName;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  JavascriptStringObject *this_local;
  
  if (propertyId == 0xd1) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_01 = ScriptContext::GetPropertyName(this_00,0xd1);
    varName = PropertyRecord::GetBuffer(this_01);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,scriptContext,varName);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,flags);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptStringObject::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        if (propertyId == PropertyIds::length)
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());

            return FALSE;
        }
        return DynamicObject::DeleteProperty(propertyId, flags);
    }